

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.hpp
# Opt level: O2

void __thiscall
foxxll::block_manager::
new_blocks<foxxll::random_cyclic,__gnu_cxx::__normal_iterator<foxxll::BID<0ul>*,std::vector<foxxll::BID<0ul>,std::allocator<foxxll::BID<0ul>>>>>
          (block_manager *this,random_cyclic *functor,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_begin,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_end,size_t alloc_offset)

{
  size_t sVar1;
  value_type *ppdVar2;
  value_type pdVar3;
  unsigned_long uVar4;
  external_size_type eVar5;
  undefined1 auVar6 [16];
  value_type *pvVar7;
  long lVar8;
  ulong uVar9;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  _Var10;
  ulong uVar11;
  ulong uVar12;
  size_t d;
  pointer pvVar13;
  undefined1 auVar14 [16];
  simple_vector<BIDType> bids;
  simple_vector<size_t> disk_blocks;
  simple_vector<uint64_t> disk_bytes;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  disk_out;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex_);
  tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::SimpleVector
            (&disk_blocks,&this->ndisks_);
  tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::SimpleVector
            (&disk_bytes,&this->ndisks_);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&disk_out,this->ndisks_,(allocator_type *)&bids);
  for (lVar8 = 0; disk_blocks.size_ << 3 != lVar8; lVar8 = lVar8 + 8) {
    *(undefined8 *)((long)disk_blocks.array_ + lVar8) = 0;
  }
  for (lVar8 = 0; disk_bytes.size_ << 3 != lVar8; lVar8 = lVar8 + 8) {
    *(undefined8 *)((long)disk_bytes.array_ + lVar8) = 0;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = bids.array_;
  bids = (simple_vector<BIDType>)(auVar6 << 0x40);
  uVar9 = 0;
  _Var10._M_current = bid_begin._M_current;
  do {
    if ((ulong)(((long)bid_end._M_current - (long)bid_begin._M_current) / 0x18) <= uVar9) {
      bids.size_ = 0;
      bids.array_ = (value_type *)0x0;
      for (uVar9 = 0; uVar9 < this->ndisks_; uVar9 = uVar9 + 1) {
        if (disk_blocks.array_[uVar9] != 0) {
          tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::resize
                    (&bids,disk_blocks.array_[uVar9]);
          pvVar13 = disk_out.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar9;
          pvVar7 = bids.array_;
          for (uVar11 = 0; uVar11 < disk_blocks.array_[uVar9]; uVar11 = uVar11 + 1) {
            uVar4 = (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar11];
            pvVar7->size = bid_begin._M_current[uVar4].size;
            eVar5 = bid_begin._M_current[uVar4].offset;
            pvVar7->storage = bid_begin._M_current[uVar4].storage;
            pvVar7->offset = eVar5;
            pvVar7 = pvVar7 + 1;
          }
          disk_block_allocator::new_blocks<0ul>((this->block_allocators_).array_[uVar9],&bids);
          pvVar7 = bids.array_;
          for (uVar11 = 0; uVar11 < disk_blocks.array_[uVar9]; uVar11 = uVar11 + 1) {
            pvVar7->storage = (this->disk_files_).array_[uVar9].ptr_;
            uVar4 = (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar11];
            bid_begin._M_current[uVar4].size = pvVar7->size;
            eVar5 = pvVar7->offset;
            bid_begin._M_current[uVar4].storage = pvVar7->storage;
            bid_begin._M_current[uVar4].offset = eVar5;
            sVar1 = pvVar7->size;
            auVar14._8_4_ = (int)sVar1;
            auVar14._0_8_ = sVar1;
            auVar14._12_4_ = (int)(sVar1 >> 0x20);
            this->total_allocation_ = sVar1 + this->total_allocation_;
            this->current_allocation_ = auVar14._8_8_ + this->current_allocation_;
            pvVar7 = pvVar7 + 1;
          }
        }
      }
      uVar9 = this->current_allocation_;
      if (this->current_allocation_ < this->maximum_allocation_) {
        uVar9 = this->maximum_allocation_;
      }
      this->maximum_allocation_ = uVar9;
      tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::~SimpleVector(&bids);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&disk_out);
      tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::~SimpleVector(&disk_bytes);
      tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::~SimpleVector(&disk_blocks);
      std::unique_lock<std::mutex>::~unique_lock(&lock);
      return;
    }
    uVar11 = (functor->perm_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start
             [(uVar9 + alloc_offset) % (functor->super_striping).diff_] +
             (functor->super_striping).begin_;
    ppdVar2 = (this->block_allocators_).array_;
    pdVar3 = ppdVar2[uVar11];
    uVar9 = uVar11;
    if ((pdVar3->autogrow_ == false) &&
       (pdVar3->free_bytes_ < disk_bytes.array_[uVar11] + (_Var10._M_current)->size)) {
      uVar12 = 1;
      while (uVar9 = uVar11, uVar12 < this->ndisks_) {
        uVar9 = (uVar11 + uVar12) % this->ndisks_;
        pdVar3 = ppdVar2[uVar9];
        if ((pdVar3->autogrow_ != false) ||
           (uVar12 = uVar12 + 1,
           disk_bytes.array_[uVar9] + (_Var10._M_current)->size <= pdVar3->free_bytes_)) break;
      }
    }
    disk_blocks.array_[uVar9] = disk_blocks.array_[uVar9] + 1;
    disk_bytes.array_[uVar9] = disk_bytes.array_[uVar9] + (_Var10._M_current)->size;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (disk_out.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar9,&bids.size_);
    uVar9 = bids.size_ + 1;
    bids.size_ = uVar9;
    _Var10._M_current = _Var10._M_current + 1;
  } while( true );
}

Assistant:

void block_manager::new_blocks(
    const DiskAssignFunctor& functor,
    BIDIterator bid_begin, BIDIterator bid_end,
    size_t alloc_offset)
{
    std::unique_lock<std::mutex> lock(mutex_);

    using BIDType = typename std::iterator_traits<BIDIterator>::value_type;

    // choose disks for each block, sum up bytes allocated on a disk

    tlx::simple_vector<size_t> disk_blocks(ndisks_);
    tlx::simple_vector<uint64_t> disk_bytes(ndisks_);
    std::vector<std::vector<size_t> > disk_out(ndisks_);

    disk_blocks.fill(0);
    disk_bytes.fill(0);

    size_t bid_size = static_cast<size_t>(bid_end - bid_begin);

    BIDIterator bid = bid_begin;
    for (size_t i = 0; i < bid_size; ++i, ++bid)
    {
        size_t disk_id = functor(alloc_offset + i);

        if (!block_allocators_[disk_id]->has_available_space(
                disk_bytes[disk_id] + bid->size
            ))
        {
            // find disk (cyclically) that has enough free space for block

            for (size_t adv = 1; adv < ndisks_; ++adv)
            {
                size_t try_disk_id = (disk_id + adv) % ndisks_;
                if (block_allocators_[try_disk_id]->has_available_space(
                        disk_bytes[try_disk_id] + bid->size
                    ))
                {
                    disk_id = try_disk_id;
                    break;
                }
            }

            // if no disk has free space, pick first selected by functor
        }

        // assign block to disk
        disk_blocks[disk_id]++;
        disk_bytes[disk_id] += bid->size;
        disk_out[disk_id].push_back(i);
    }

    // allocate blocks on disks in sequence, then scatter blocks into output

    tlx::simple_vector<BIDType> bids;

    for (size_t d = 0; d < ndisks_; ++d)
    {
        if (disk_blocks[d] == 0) continue;
        bids.resize(disk_blocks[d]);

        std::vector<size_t>& bid_perm = disk_out[d];

        // collect bids from output (due to size field for BID<0>)
        for (size_t i = 0; i < disk_blocks[d]; ++i)
            bids[i] = bid_begin[bid_perm[i]];

        // let block_allocator fill in offset fields
        block_allocators_[d]->new_blocks(bids);

        // distributed bids back to output
        for (size_t i = 0; i < disk_blocks[d]; ++i) {
            bids[i].storage = disk_files_[d].get();

            TLX_LOGC(verbose_block_life_cycle) << "BLC:new    " << bids[i];
            bid_begin[bid_perm[i]] = bids[i];

            total_allocation_ += bids[i].size;
            current_allocation_ += bids[i].size;
        }
    }

    maximum_allocation_ = std::max(maximum_allocation_, current_allocation_);
}